

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  stbi_uc *psVar1;
  ushort uVar2;
  byte bVar3;
  stbi_uc sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  stbi__uint16 *data;
  byte *pbVar14;
  stbi_uc *psVar15;
  ulong uVar16;
  stbi_uc *psVar17;
  uint uVar18;
  long lVar19;
  uint y_00;
  uint uVar20;
  uint x_00;
  stbi_uc *psVar21;
  stbi__uint16 *psVar22;
  stbi__uint16 *psVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  stbi__uint16 *local_60;
  
  iVar5 = stbi__get16be(s);
  uVar6 = stbi__get16be(s);
  if ((uVar6 | iVar5 << 0x10) != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (void *)0x0;
  }
  iVar5 = stbi__get16be(s);
  if (iVar5 != 1) {
    stbi__g_failure_reason = "wrong version";
    return (void *)0x0;
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar5 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar5 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar5);
      goto LAB_001cac4f;
    }
  }
  s->img_buffer = s->img_buffer + 6;
LAB_001cac4f:
  uVar6 = stbi__get16be(s);
  if (uVar6 < 0x11) {
    iVar5 = stbi__get16be(s);
    iVar7 = stbi__get16be(s);
    iVar8 = stbi__get16be(s);
    iVar9 = stbi__get16be(s);
    iVar10 = stbi__get16be(s);
    if ((iVar10 == 8) || (iVar10 == 0x10)) {
      iVar11 = stbi__get16be(s);
      if (iVar11 == 3) {
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        uVar12 = stbi__get16be(s);
        if (uVar12 < 2) {
          iVar5 = iVar5 * 0x10000;
          y_00 = iVar5 + iVar7;
          iVar8 = iVar8 * 0x10000;
          x_00 = iVar8 + iVar9;
          iVar11 = stbi__mad3sizes_valid(4,x_00,y_00,0);
          if (iVar11 == 0) {
            stbi__g_failure_reason = "too large";
          }
          else {
            if (((bpc == 0x10) && (iVar10 == 0x10)) && (uVar12 == 0)) {
              data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,y_00,0);
              ri->bits_per_channel = 0x10;
            }
            else {
              data = (stbi__uint16 *)malloc((long)(int)(y_00 * x_00 * 4));
            }
            if (data != (stbi__uint16 *)0x0) {
              uVar18 = x_00 * y_00;
              if (uVar12 == 0) {
                psVar1 = s->buffer_start;
                iVar11 = (iVar7 + iVar5) * (iVar9 + iVar8);
                uVar16 = 0;
                psVar22 = data;
                psVar23 = data;
                do {
                  if (uVar16 < uVar6) {
                    if (ri->bits_per_channel == 0x10) {
                      if (0 < (int)uVar18) {
                        lVar19 = 0;
                        do {
                          iVar13 = stbi__get16be(s);
                          psVar23[lVar19 * 4] = (stbi__uint16)iVar13;
                          lVar19 = lVar19 + 1;
                        } while (iVar11 != (int)lVar19);
                      }
                    }
                    else if (iVar10 == 0x10) {
                      if (0 < (int)uVar18) {
                        lVar19 = 0;
                        do {
                          iVar13 = stbi__get16be(s);
                          *(char *)(psVar22 + lVar19 * 2) = (char)((uint)iVar13 >> 8);
                          lVar19 = lVar19 + 1;
                        } while (iVar11 != (int)lVar19);
                      }
                    }
                    else if (0 < (int)uVar18) {
                      lVar19 = 0;
                      do {
                        psVar17 = s->img_buffer;
                        if (psVar17 < s->img_buffer_end) {
LAB_001cb2c1:
                          s->img_buffer = psVar17 + 1;
                          sVar4 = *psVar17;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar13 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar13;
                            }
                            psVar17 = s->img_buffer;
                            goto LAB_001cb2c1;
                          }
                          sVar4 = '\0';
                        }
                        *(stbi_uc *)(psVar22 + lVar19 * 2) = sVar4;
                        lVar19 = lVar19 + 1;
                      } while (iVar11 != (int)lVar19);
                    }
                  }
                  else if (iVar10 == 0x10 && bpc == 0x10) {
                    if (0 < (int)uVar18) {
                      lVar19 = 0;
                      do {
                        psVar23[lVar19 * 4] = -(ushort)(uVar16 == 3);
                        lVar19 = lVar19 + 1;
                      } while (iVar11 != (int)lVar19);
                    }
                  }
                  else if (0 < (int)uVar18) {
                    lVar19 = 0;
                    do {
                      *(char *)(psVar22 + lVar19 * 2) = -(uVar16 == 3);
                      lVar19 = lVar19 + 1;
                    } while (iVar11 != (int)lVar19);
                  }
                  uVar16 = uVar16 + 1;
                  psVar22 = (stbi__uint16 *)((long)psVar22 + 1);
                  psVar23 = psVar23 + 1;
                } while (uVar16 != 4);
              }
              else {
                stbi__skip(s,uVar6 * y_00 * 2);
                psVar1 = s->buffer_start;
                psVar17 = s->buffer_start + 1;
                uVar16 = 0;
                local_60 = data;
                do {
                  if (uVar16 < uVar6) {
                    if (0 < (int)uVar18) {
                      psVar21 = (stbi_uc *)((long)data + uVar16);
                      iVar10 = 0;
                      uVar12 = uVar18;
                      do {
                        pbVar14 = s->img_buffer;
                        if (pbVar14 < s->img_buffer_end) {
LAB_001caf57:
                          s->img_buffer = pbVar14 + 1;
                          bVar3 = *pbVar14;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar11 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar17;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar11;
                            }
                            pbVar14 = s->img_buffer;
                            goto LAB_001caf57;
                          }
                          bVar3 = 0;
                        }
                        if (bVar3 != 0x80) {
                          uVar24 = (uint)bVar3;
                          if ((char)bVar3 < '\0') {
                            uVar20 = 0x101 - uVar24;
                            if (uVar20 <= uVar12) {
                              psVar15 = s->img_buffer;
                              if (psVar15 < s->img_buffer_end) {
LAB_001cb089:
                                s->img_buffer = psVar15 + 1;
                                sVar4 = *psVar15;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen)
                                  ;
                                  if (iVar11 == 0) {
                                    s->read_from_callbacks = 0;
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar17;
                                    s->buffer_start[0] = '\0';
                                  }
                                  else {
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar1 + iVar11;
                                  }
                                  psVar15 = s->img_buffer;
                                  goto LAB_001cb089;
                                }
                                sVar4 = '\0';
                              }
                              iVar11 = uVar24 - 0x101;
                              do {
                                *psVar21 = sVar4;
                                psVar21 = psVar21 + 4;
                                iVar11 = iVar11 + 1;
                              } while (iVar11 != 0);
                              iVar10 = iVar10 + uVar20;
                            }
                            if (uVar12 < uVar20) {
LAB_001cb116:
                              free(data);
                              stbi__g_failure_reason = "corrupt";
                              return (void *)0x0;
                            }
                          }
                          else {
                            if (uVar12 <= bVar3) goto LAB_001cb116;
                            iVar11 = uVar24 + 1;
                            do {
                              psVar15 = s->img_buffer;
                              if (psVar15 < s->img_buffer_end) {
LAB_001cafec:
                                s->img_buffer = psVar15 + 1;
                                sVar4 = *psVar15;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen)
                                  ;
                                  if (iVar13 == 0) {
                                    s->read_from_callbacks = 0;
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar17;
                                    s->buffer_start[0] = '\0';
                                  }
                                  else {
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar1 + iVar13;
                                  }
                                  psVar15 = s->img_buffer;
                                  goto LAB_001cafec;
                                }
                                sVar4 = '\0';
                              }
                              *psVar21 = sVar4;
                              psVar21 = psVar21 + 4;
                              iVar11 = iVar11 + -1;
                            } while (iVar11 != 0);
                            iVar10 = iVar10 + uVar24 + 1;
                          }
                        }
                        uVar12 = uVar18 - iVar10;
                      } while (uVar12 != 0 && iVar10 <= (int)uVar18);
                    }
                  }
                  else if (0 < (int)uVar18) {
                    lVar19 = 0;
                    do {
                      *(char *)(local_60 + lVar19 * 2) = -(uVar16 == 3);
                      lVar19 = lVar19 + 1;
                    } while ((iVar7 + iVar5) * (iVar9 + iVar8) != (int)lVar19);
                  }
                  uVar16 = uVar16 + 1;
                  local_60 = (stbi__uint16 *)((long)local_60 + 1);
                } while (uVar16 != 4);
              }
              if (3 < uVar6) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar18) {
                    uVar16 = 0;
                    do {
                      uVar2 = data[uVar16 * 4 + 3];
                      if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                        fVar26 = 1.0 / ((float)uVar2 / 65535.0);
                        fVar25 = (1.0 - fVar26) * 65535.0;
                        data[uVar16 * 4] =
                             (stbi__uint16)(int)((float)data[uVar16 * 4] * fVar26 + fVar25);
                        data[uVar16 * 4 + 1] =
                             (stbi__uint16)(int)((float)data[uVar16 * 4 + 1] * fVar26 + fVar25);
                        data[uVar16 * 4 + 2] =
                             (stbi__uint16)(int)((float)data[uVar16 * 4 + 2] * fVar26 + fVar25);
                      }
                      uVar16 = uVar16 + 1;
                    } while ((uint)((iVar7 + iVar5) * (iVar9 + iVar8)) != uVar16);
                  }
                }
                else if (0 < (int)uVar18) {
                  uVar16 = 0;
                  do {
                    bVar3 = *(byte *)((long)data + uVar16 * 4 + 3);
                    if ((bVar3 != 0) && (bVar3 != 0xff)) {
                      fVar26 = 1.0 / ((float)bVar3 / 255.0);
                      fVar25 = (1.0 - fVar26) * 255.0;
                      *(char *)(data + uVar16 * 2) =
                           (char)(int)((float)(byte)data[uVar16 * 2] * fVar26 + fVar25);
                      *(char *)((long)data + uVar16 * 4 + 1) =
                           (char)(int)((float)*(byte *)((long)data + uVar16 * 4 + 1) * fVar26 +
                                      fVar25);
                      *(char *)(data + uVar16 * 2 + 1) =
                           (char)(int)((float)(byte)data[uVar16 * 2 + 1] * fVar26 + fVar25);
                    }
                    uVar16 = uVar16 + 1;
                  } while ((uint)((iVar7 + iVar5) * (iVar9 + iVar8)) != uVar16);
                }
              }
              if ((req_comp & 0xfffffffbU) != 0) {
                if (ri->bits_per_channel == 0x10) {
                  data = stbi__convert_format16(data,4,req_comp,x_00,y_00);
                }
                else {
                  data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,y_00);
                }
                if (data == (stbi__uint16 *)0x0) {
                  return (void *)0x0;
                }
              }
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
            stbi__g_failure_reason = "outofmem";
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}